

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O1

void transpose_16bit_16x16_avx2(__m256i *in,__m256i *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  __m256i t [16];
  __m256i u [16];
  __m256i t_1 [16];
  undefined1 auStack_660 [32];
  longlong local_640;
  longlong lStack_638;
  longlong lStack_630;
  longlong lStack_628;
  longlong local_620;
  longlong lStack_618;
  longlong local_610;
  longlong lStack_608;
  longlong local_600;
  longlong lStack_5f8;
  longlong local_5f0;
  longlong lStack_5e8;
  longlong local_5e0;
  longlong lStack_5d8;
  longlong local_5d0;
  longlong lStack_5c8;
  longlong local_5c0;
  longlong lStack_5b8;
  longlong local_5b0;
  longlong lStack_5a8;
  longlong local_5a0;
  longlong lStack_598;
  longlong local_590;
  longlong lStack_588;
  longlong local_580;
  longlong lStack_578;
  longlong local_570;
  longlong lStack_568;
  longlong local_560;
  longlong lStack_558;
  longlong local_550;
  longlong lStack_548;
  longlong local_540;
  longlong lStack_538;
  longlong local_530;
  longlong lStack_528;
  longlong local_520;
  longlong lStack_518;
  longlong local_510;
  longlong lStack_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong local_4f0;
  longlong lStack_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong local_4d0;
  longlong lStack_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong local_4b0;
  longlong lStack_4a8;
  longlong local_4a0;
  longlong lStack_498;
  longlong local_490;
  longlong lStack_488;
  longlong local_480;
  longlong lStack_478;
  longlong local_470;
  longlong lStack_468;
  longlong local_460;
  longlong lStack_458;
  longlong local_450;
  longlong lStack_448;
  undefined1 auStack_440 [32];
  undefined1 auStack_420 [96];
  undefined1 auStack_3c0 [32];
  undefined1 auStack_3a0 [160];
  undefined1 auStack_300 [64];
  undefined1 auStack_2c0 [64];
  undefined1 auStack_280 [32];
  undefined1 auStack_260 [32];
  undefined1 auStack_240 [568];
  
  lStack_630 = in[8][0];
  lStack_628 = in[8][1];
  local_640 = (*in)[0];
  lStack_638 = (*in)[1];
  local_610 = in[9][0];
  lStack_608 = in[9][1];
  local_620 = in[1][0];
  lStack_618 = in[1][1];
  local_5f0 = in[10][0];
  lStack_5e8 = in[10][1];
  local_600 = in[2][0];
  lStack_5f8 = in[2][1];
  local_5d0 = in[0xb][0];
  lStack_5c8 = in[0xb][1];
  local_5e0 = in[3][0];
  lStack_5d8 = in[3][1];
  local_5b0 = in[0xc][0];
  lStack_5a8 = in[0xc][1];
  local_5c0 = in[4][0];
  lStack_5b8 = in[4][1];
  local_590 = in[0xd][0];
  lStack_588 = in[0xd][1];
  local_5a0 = in[5][0];
  lStack_598 = in[5][1];
  local_570 = in[0xe][0];
  lStack_568 = in[0xe][1];
  local_580 = in[6][0];
  lStack_578 = in[6][1];
  local_550 = in[0xf][0];
  lStack_548 = in[0xf][1];
  local_560 = in[7][0];
  lStack_558 = in[7][1];
  local_530 = in[8][2];
  lStack_528 = in[8][3];
  local_540 = (*in)[2];
  lStack_538 = (*in)[3];
  local_510 = in[9][2];
  lStack_508 = in[9][3];
  local_520 = in[1][2];
  lStack_518 = in[1][3];
  local_4f0 = in[10][2];
  lStack_4e8 = in[10][3];
  local_500 = in[2][2];
  lStack_4f8 = in[2][3];
  local_4d0 = in[0xb][2];
  lStack_4c8 = in[0xb][3];
  local_4e0 = in[3][2];
  lStack_4d8 = in[3][3];
  local_4b0 = in[0xc][2];
  lStack_4a8 = in[0xc][3];
  local_4c0 = in[4][2];
  lStack_4b8 = in[4][3];
  local_490 = in[0xd][2];
  lStack_488 = in[0xd][3];
  local_4a0 = in[5][2];
  lStack_498 = in[5][3];
  local_470 = in[0xe][2];
  lStack_468 = in[0xe][3];
  local_480 = in[6][2];
  lStack_478 = in[6][3];
  local_450 = in[0xf][2];
  lStack_448 = in[0xf][3];
  local_460 = in[7][2];
  lStack_458 = in[7][3];
  lVar4 = 0x20;
  do {
    auVar3 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_660 + lVar4),
                             *(undefined1 (*) [32])((long)&local_640 + lVar4));
    *(undefined1 (*) [32])(auStack_260 + lVar4) = auVar3;
    auVar3 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_660 + lVar4),
                             *(undefined1 (*) [32])((long)&local_640 + lVar4));
    *(undefined1 (*) [32])(auStack_240 + lVar4) = auVar3;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x120);
  lVar4 = 0xc0;
  do {
    auVar3 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_300 + lVar4),
                             *(undefined1 (*) [32])(auStack_2c0 + lVar4));
    *(undefined1 (*) [32])((long)&local_500 + lVar4) = auVar3;
    auVar3 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_300 + lVar4),
                             *(undefined1 (*) [32])(auStack_2c0 + lVar4));
    *(undefined1 (*) [32])((long)&local_4c0 + lVar4) = auVar3;
    auVar3 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_280 + lVar4),
                             *(undefined1 (*) [32])(auStack_240 + lVar4));
    *(undefined1 (*) [32])((long)&local_480 + lVar4) = auVar3;
    auVar3 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_280 + lVar4),
                             *(undefined1 (*) [32])(auStack_240 + lVar4));
    *(undefined1 (*) [32])(auStack_440 + lVar4) = auVar3;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 == 0xe0);
  lVar4 = 0xa0;
  do {
    auVar3 = *(undefined1 (*) [32])((long)&local_4e0 + lVar4);
    auVar1 = *(undefined1 (*) [32])((long)&local_460 + lVar4);
    auVar2 = vunpcklpd_avx(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[-5] + lVar4) = auVar2;
    auVar3 = vunpckhpd_avx(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[-4] + lVar4) = auVar3;
    auVar3 = *(undefined1 (*) [32])((long)&local_4c0 + lVar4);
    auVar1 = *(undefined1 (*) [32])(auStack_440 + lVar4);
    auVar2 = vpunpcklqdq_avx2(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[-1] + lVar4) = auVar2;
    auVar3 = vpunpckhqdq_avx2(auVar3,auVar1);
    *(undefined1 (*) [32])((long)*out + lVar4) = auVar3;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 == 0xe0);
  lVar4 = 0x20;
  do {
    auVar3 = vpunpcklwd_avx2(*(undefined1 (*) [32])((long)&local_560 + lVar4),
                             *(undefined1 (*) [32])((long)&local_540 + lVar4));
    *(undefined1 (*) [32])(auStack_260 + lVar4) = auVar3;
    auVar3 = vpunpckhwd_avx2(*(undefined1 (*) [32])((long)&local_560 + lVar4),
                             *(undefined1 (*) [32])((long)&local_540 + lVar4));
    *(undefined1 (*) [32])(auStack_240 + lVar4) = auVar3;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x120);
  lVar4 = 0xc0;
  do {
    auVar3 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_300 + lVar4),
                             *(undefined1 (*) [32])(auStack_2c0 + lVar4));
    *(undefined1 (*) [32])((long)&local_500 + lVar4) = auVar3;
    auVar3 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_300 + lVar4),
                             *(undefined1 (*) [32])(auStack_2c0 + lVar4));
    *(undefined1 (*) [32])((long)&local_4c0 + lVar4) = auVar3;
    auVar3 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_280 + lVar4),
                             *(undefined1 (*) [32])(auStack_240 + lVar4));
    *(undefined1 (*) [32])((long)&local_480 + lVar4) = auVar3;
    auVar3 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_280 + lVar4),
                             *(undefined1 (*) [32])(auStack_240 + lVar4));
    *(undefined1 (*) [32])(auStack_440 + lVar4) = auVar3;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 == 0xe0);
  lVar4 = 0;
  do {
    auVar3 = *(undefined1 (*) [32])(auStack_440 + lVar4);
    auVar1 = *(undefined1 (*) [32])(auStack_3c0 + lVar4);
    auVar2 = vunpcklpd_avx(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[8] + lVar4) = auVar2;
    auVar3 = vunpckhpd_avx(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[9] + lVar4) = auVar3;
    auVar3 = *(undefined1 (*) [32])(auStack_420 + lVar4);
    auVar1 = *(undefined1 (*) [32])(auStack_3a0 + lVar4);
    auVar2 = vpunpcklqdq_avx2(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[0xc] + lVar4) = auVar2;
    auVar3 = vpunpckhqdq_avx2(auVar3,auVar1);
    *(undefined1 (*) [32])((long)out[0xd] + lVar4) = auVar3;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 == 0x40);
  return;
}

Assistant:

static inline void transpose_16bit_16x16_avx2(const __m256i *const in,
                                              __m256i *const out) {
  __m256i t[16];

#define LOADL(idx)                                                            \
  t[idx] = _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx])); \
  t[idx] = _mm256_inserti128_si256(                                           \
      t[idx], _mm_load_si128((__m128i const *)&in[idx + 8]), 1);

#define LOADR(idx)                                                           \
  t[8 + idx] =                                                               \
      _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx] + 1)); \
  t[8 + idx] = _mm256_inserti128_si256(                                      \
      t[8 + idx], _mm_load_si128((__m128i const *)&in[idx + 8] + 1), 1);

  // load left 8x16
  LOADL(0)
  LOADL(1)
  LOADL(2)
  LOADL(3)
  LOADL(4)
  LOADL(5)
  LOADL(6)
  LOADL(7)

  // load right 8x16
  LOADR(0)
  LOADR(1)
  LOADR(2)
  LOADR(3)
  LOADR(4)
  LOADR(5)
  LOADR(6)
  LOADR(7)

  // get the top 16x8 result
  transpose2_8x8_avx2(t, out);
  // get the bottom 16x8 result
  transpose2_8x8_avx2(&t[8], &out[8]);
}